

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

bool __thiscall
mprpc::MpRpcServer::notify(MpRpcServer *this,string *conn_id,char *method,void *data,size_t size)

{
  size_t __n;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  msgpack_sbuffer *sbuf;
  byte bVar5;
  MsgPackPacker *pMVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int __flags;
  code *pcVar7;
  long *plVar8;
  MsgPackPacker pk;
  unique_lock<std::recursive_mutex> lock;
  MsgPackPacker local_98;
  undefined1 local_68 [16];
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  size_t local_38;
  
  __flags = (int)size;
  local_98.pk.data = &local_98;
  pMVar6 = &local_98;
  local_98.sb.size = 0;
  local_98.sb.data = (char *)0x0;
  local_98.sb.alloc = 0;
  pcVar7 = msgpack_sbuffer_write;
  local_98.pk.callback = msgpack_sbuffer_write;
  local_38 = size;
  pcVar2 = (char *)malloc(0x2000);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)malloc(0x2000);
    if (pcVar2 == (char *)0x0) goto LAB_00139896;
    lVar4 = 0;
  }
  else {
    *pcVar2 = -0x7d;
    local_98.sb.size = 1;
    lVar4 = 1;
  }
  local_98.sb.alloc = 0x2000;
  local_98.sb.size = local_98.sb.size + 1;
  pcVar2[lVar4] = -0x5e;
  pMVar6 = (MsgPackPacker *)local_98.pk.data;
  pcVar7 = local_98.pk.callback;
  local_98.sb.data = pcVar2;
LAB_00139896:
  (*pcVar7)(pMVar6,"id",2);
  local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
  (*local_98.pk.callback)(local_98.pk.data,local_68,1);
  MsgPackPacker::pack_map_item(&local_98,"method",method);
  local_68[0] = 0xa6;
  (*local_98.pk.callback)(local_98.pk.data,local_68,1);
  (*local_98.pk.callback)(local_98.pk.data,"params",6);
  (*local_98.pk.callback)(local_98.pk.data,(char *)data,local_38);
  local_68._0_8_ = this + 8;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
  local_68[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)this_00);
  local_68[8] = true;
  plVar8 = *(long **)(this + 0x40);
  bVar5 = 1;
  if (plVar8 != (long *)0x0) {
    do {
      __n = conn_id->_M_string_length;
      if (__n == 0) {
        local_48 = plVar8[5];
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[6];
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_40->_M_use_count = local_40->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_40->_M_use_count = local_40->_M_use_count + 1;
          }
        }
        send((MpRpcServer *)this_00,(int)&local_48,local_98.sb.data,local_98.sb.size,__flags);
        this_00 = local_40;
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        }
      }
      else if (__n == plVar8[2]) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(conn_id->_M_dataplus)._M_p;
        iVar1 = bcmp(this_00,(void *)plVar8[1],__n);
        if (iVar1 == 0) {
          local_58 = plVar8[5];
          local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[6];
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_50->_M_use_count = local_50->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_50->_M_use_count = local_50->_M_use_count + 1;
            }
          }
          uVar3 = send((MpRpcServer *)this_00,(int)&local_58,local_98.sb.data,local_98.sb.size,
                       __flags);
          conn_id = (string *)(uVar3 & 0xffffffff);
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
          }
          bVar5 = 0;
          break;
        }
      }
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)0x0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_68);
  free(local_98.sb.data);
  return (bool)(bVar5 | (byte)conn_id & 1);
}

Assistant:

bool MpRpcServer::notify(const string& conn_id, const char* method, const void* data, size_t size)
    {
        MsgPackPacker pk;
        pk.pack_map(3);

        pk.pack_map_item("id", 0);
        pk.pack_map_item("method", method);
        pk.pack_string("params");
        msgpack_pack_str_body(&pk.pk, data, size);

        unique_lock<recursive_mutex> lock(m_conn_map_lock);

        for (auto it = m_conn_map.begin(); it != m_conn_map.end(); it++) {
            if (conn_id.empty()) {
                send(it->second, pk.sb.data, pk.sb.size);
            }
            else if (conn_id == it->first) {
                return send(it->second, pk.sb.data, pk.sb.size);
            }
        }
        return true;
    }